

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::ResetFence(VulkanLogicalDevice *this,VkFence fence)

{
  VkResult VVar1;
  VkFence fence_local;
  string msg;
  
  fence_local = fence;
  VVar1 = (*vkResetFences)(this->m_VkDevice,1,&fence_local);
  if (VVar1 != VK_SUCCESS) {
    Diligent::FormatString<char[23]>(&msg,(char (*) [23])"vkResetFences() failed");
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"ResetFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x28a);
    std::__cxx11::string::~string((string *)&msg);
  }
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::ResetFence(VkFence fence) const
{
    VkResult err = vkResetFences(m_VkDevice, 1, &fence);
    DEV_CHECK_ERR(err == VK_SUCCESS, "vkResetFences() failed");
    return err;
}